

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O1

timestamp_t __thiscall
duckdb::TimeBucket::OriginWidthConvertibleToMonthsTernaryOperator::
Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t>
          (OriginWidthConvertibleToMonthsTernaryOperator *this,interval_t bucket_width,
          timestamp_t ts,timestamp_t origin)

{
  bool bVar1;
  int32_t left;
  int32_t iVar2;
  int iVar3;
  int iVar4;
  date_t dVar5;
  timestamp_t ts_00;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [12];
  timestamp_t result;
  timestamp_t local_48;
  string local_40;
  
  ts_00.value = bucket_width.micros;
  bVar1 = duckdb::Value::IsFinite<duckdb::timestamp_t>(ts_00);
  if (bVar1) {
    left = EpochMonths<duckdb::timestamp_t>(ts_00);
    iVar2 = EpochMonths<duckdb::timestamp_t>(ts);
    iVar6 = (int)this;
    iVar3 = SubtractOperatorOverflowCheck::Operation<int,int,int>(left,iVar2 % iVar6);
    iVar4 = iVar3 - iVar3 % iVar6;
    if (iVar3 % iVar6 != 0 && iVar3 < 0) {
      iVar4 = SubtractOperatorOverflowCheck::Operation<int,int,int>(iVar4,iVar6);
    }
    iVar4 = iVar4 + iVar2 % iVar6;
    iVar6 = iVar4 % 0xc;
    iVar3 = iVar6 + 1;
    if (iVar6 != 0 && -1 >= iVar4) {
      iVar3 = iVar6 + 0xd;
    }
    dVar5.days = duckdb::Date::FromDate((iVar6 == 0 || -1 < iVar4) + 0x7b1 + iVar4 / 0xc,iVar3,1);
    bVar1 = duckdb::TryCast::Operation<duckdb::date_t,duckdb::timestamp_t>(dVar5,&local_48,false);
    if (!bVar1) {
      auVar8 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::timestamp_t>
                (&local_40,(duckdb *)(ulong)(uint)dVar5.days,(date_t)auVar8._8_4_);
      duckdb::InvalidInputException::InvalidInputException(auVar8._0_8_,(string *)&local_40);
      __cxa_throw(auVar8._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    bVar1 = duckdb::TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>
                      (ts_00,&local_48,false);
    if (!bVar1) {
      auVar7 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_t>
                (&local_40,(duckdb *)ts_00.value,(timestamp_t)auVar7._8_8_);
      duckdb::InvalidInputException::InvalidInputException(auVar7._0_8_,(string *)&local_40);
      __cxa_throw(auVar7._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return (timestamp_t)local_48.value;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts, TC origin) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int32_t ts_months = EpochMonths(ts);
			int32_t origin_months = EpochMonths(origin);
			return Cast::template Operation<date_t, TR>(
			    WidthConvertibleToMonthsCommon(bucket_width.months, ts_months, origin_months));
		}